

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

_Bool square_isempty(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  trap_kind_conflict *ptVar2;
  object *poVar3;
  
  _Var1 = square_trap_flag((chunk *)c,grid,L'\x02');
  if (!_Var1) {
    ptVar2 = lookup_trap("web");
    _Var1 = square_trap_specific((chunk *)c,grid,ptVar2->tidx);
    if ((!_Var1) && (_Var1 = square_isopen(c,grid), _Var1)) {
      poVar3 = square_object(c,grid);
      return poVar3 == (object *)0x0;
    }
  }
  return false;
}

Assistant:

bool square_isempty(struct chunk *c, struct loc grid) {
	if (square_isplayertrap(c, grid)) return false;
	if (square_iswebbed(c, grid)) return false;
	return square_isopen(c, grid) && !square_object(c, grid);
}